

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

FArchive * operator<<(FArchive *arc,acsdefered_t **defertop)

{
  undefined8 in_RAX;
  FArchive *pFVar1;
  acsdefered_t *paVar2;
  acsdefered_t **defer;
  BYTE more;
  BYTE type;
  byte local_22;
  BYTE local_21;
  
  if (arc->m_Storing == true) {
    paVar2 = *defertop;
    if (paVar2 != (acsdefered_t *)0x0) {
      do {
        FArchive::operator<<(arc,&local_22);
        FArchive::operator<<(arc,&local_21);
        P_SerializeACSScriptNumber(arc,&paVar2->script,false);
        pFVar1 = FArchive::operator<<(arc,(DWORD *)&paVar2->playernum);
        pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)paVar2->args);
        pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)(paVar2->args + 1));
        FArchive::operator<<(pFVar1,(DWORD *)(paVar2->args + 2));
        paVar2 = paVar2->next;
      } while (paVar2 != (acsdefered_t *)0x0);
    }
    FArchive::operator<<(arc,&local_22);
  }
  else {
    FArchive::operator<<(arc,&local_22);
    local_22 = (byte)((ulong)in_RAX >> 0x30);
    if (local_22 != 0) {
      do {
        paVar2 = (acsdefered_t *)operator_new(0x20);
        ((acsdefered_t *)defertop)->next = paVar2;
        FArchive::operator<<(arc,&local_22);
        paVar2 = ((acsdefered_t *)defertop)->next;
        paVar2->type = (uint)local_22;
        P_SerializeACSScriptNumber(arc,&paVar2->script,false);
        pFVar1 = FArchive::operator<<(arc,(DWORD *)&((acsdefered_t *)defertop)->next->playernum);
        pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)((acsdefered_t *)defertop)->next->args);
        pFVar1 = FArchive::operator<<(pFVar1,(DWORD *)(((acsdefered_t *)defertop)->next->args + 1));
        FArchive::operator<<(pFVar1,(DWORD *)(((acsdefered_t *)defertop)->next->args + 2));
        defertop = &((acsdefered_t *)defertop)->next->next;
        FArchive::operator<<(arc,&local_22);
      } while (local_22 != 0);
    }
    ((acsdefered_t *)defertop)->next = (acsdefered_t *)0x0;
  }
  return arc;
}

Assistant:

FArchive &operator<< (FArchive &arc, acsdefered_t *&defertop)
{
	BYTE more;

	if (arc.IsStoring ())
	{
		acsdefered_t *defer = defertop;
		more = 1;
		while (defer)
		{
			BYTE type;
			arc << more;
			type = (BYTE)defer->type;
			arc << type;
			P_SerializeACSScriptNumber(arc, defer->script, false);
			arc << defer->playernum << defer->args[0] << defer->args[1] << defer->args[2];
			defer = defer->next;
		}
		more = 0;
		arc << more;
	}
	else
	{
		acsdefered_t **defer = &defertop;

		arc << more;
		while (more)
		{
			*defer = new acsdefered_t;
			arc << more;
			(*defer)->type = (acsdefered_t::EType)more;
			P_SerializeACSScriptNumber(arc, (*defer)->script, false);
			arc << (*defer)->playernum << (*defer)->args[0] << (*defer)->args[1] << (*defer)->args[2];
			defer = &((*defer)->next);
			arc << more;
		}
		*defer = NULL;
	}
	return arc;
}